

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdImageColorReplaceArray(gdImagePtr im,int len,int *src,int *dst)

{
  int iVar1;
  void *__base;
  void *pvVar2;
  int local_58;
  int local_54;
  int n;
  int i;
  int *base;
  int *d;
  int local_38;
  int c;
  int y;
  int x;
  int *dst_local;
  int *src_local;
  gdImagePtr pgStack_18;
  int len_local;
  gdImagePtr im_local;
  
  local_58 = 0;
  if ((len < 1) || (src == dst)) {
    im_local._4_4_ = 0;
  }
  else {
    _y = dst;
    dst_local = src;
    src_local._4_4_ = len;
    pgStack_18 = im;
    if (len == 1) {
      im_local._4_4_ = gdImageColorReplace(im,*src,*dst);
    }
    else {
      iVar1 = overflow2(len,8);
      if (iVar1 == 0) {
        __base = gdMalloc((long)src_local._4_4_ << 3);
        if (__base == (void *)0x0) {
          im_local._4_4_ = -1;
        }
        else {
          for (local_54 = 0; local_54 < src_local._4_4_; local_54 = local_54 + 1) {
            *(int *)((long)__base + (long)(local_54 << 1) * 4) = dst_local[local_54];
            *(int *)((long)__base + (long)(local_54 * 2 + 1) * 4) = _y[local_54];
          }
          qsort(__base,(long)src_local._4_4_,8,colorCmp);
          if (pgStack_18->trueColor == 0) {
            for (local_38 = pgStack_18->cy1; local_38 <= pgStack_18->cy2; local_38 = local_38 + 1) {
              for (c = pgStack_18->cx1; c <= pgStack_18->cx2; c = c + 1) {
                d._4_4_ = (uint)pgStack_18->pixels[local_38][c];
                pvVar2 = bsearch((void *)((long)&d + 4),__base,(long)src_local._4_4_,8,colorCmp);
                if (pvVar2 != (void *)0x0) {
                  gdImageSetPixel(pgStack_18,c,local_38,*(int *)((long)pvVar2 + 4));
                  local_58 = local_58 + 1;
                }
              }
            }
          }
          else {
            for (local_38 = pgStack_18->cy1; local_38 <= pgStack_18->cy2; local_38 = local_38 + 1) {
              for (c = pgStack_18->cx1; c <= pgStack_18->cx2; c = c + 1) {
                d._4_4_ = pgStack_18->tpixels[local_38][c];
                pvVar2 = bsearch((void *)((long)&d + 4),__base,(long)src_local._4_4_,8,colorCmp);
                if (pvVar2 != (void *)0x0) {
                  gdImageSetPixel(pgStack_18,c,local_38,*(int *)((long)pvVar2 + 4));
                  local_58 = local_58 + 1;
                }
              }
            }
          }
          gdFree(__base);
          im_local._4_4_ = local_58;
        }
      }
      else {
        im_local._4_4_ = -1;
      }
    }
  }
  return im_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageColorReplaceArray (gdImagePtr im, int len, int *src, int *dst)
{
	register int x, y;
	int c, *d, *base;
	int i, n = 0;

	if (len <= 0 || src == dst) {
		return 0;
	}
	if (len == 1) {
		return gdImageColorReplace(im, src[0], dst[0]);
	}
	if (overflow2(len, sizeof(int)<<1)) {
		return -1;
	}
	base = (int *)gdMalloc(len * (sizeof(int)<<1));
	if (!base) {
		return -1;
	}
	for (i = 0; i < len; i++) {
		base[(i<<1)]   = src[i];
		base[(i<<1)+1] = dst[i];
	}
	qsort(base, len, sizeof(int)<<1, colorCmp);

#define REPLACING_LOOP(pixel) do {										\
		for (y = im->cy1; y <= im->cy2; y++) {							\
			for (x = im->cx1; x <= im->cx2; x++) {						\
				c = pixel(im, x, y);									\
				if ( (d = (int *)bsearch(&c, base, len, sizeof(int)<<1, colorCmp)) ) { \
					gdImageSetPixel(im, x, y, d[1]);					\
					n++;												\
				}														\
			}															\
		}																\
	} while (0)

	if (im->trueColor) {
		REPLACING_LOOP(gdImageTrueColorPixel);
	} else {
		REPLACING_LOOP(gdImagePalettePixel);
	}

#undef REPLACING_LOOP

	gdFree(base);
	return n;
}